

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

C * __thiscall
axl::sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::createBuffer
          (StringBase<short,_axl::sl::StringDetailsBase<short>_> *this,size_t length,
          bool saveContents)

{
  int32_t *piVar1;
  C *pCVar2;
  C *src;
  BufHdr *pBVar3;
  FreeFunc *pFVar4;
  size_t sVar5;
  EVP_PKEY_CTX *dst;
  ulong uVar6;
  BufHdr *pBVar7;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar5 = length * 2 + 2;
  pBVar7 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr;
  if (((pBVar7 != (BufHdr *)0x0) && (uVar6 = pBVar7->m_bufferSize, sVar5 <= uVar6)) &&
     ((pBVar7->super_RefCount).m_refCount == 1)) {
    if ((this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length == 0 ||
        !saveContents) {
      (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p = (C *)(pBVar7 + 1)
      ;
    }
    pCVar2 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p;
    if (sVar5 <= (long)pBVar7 + (uVar6 - (long)pCVar2) + 0x28) {
      (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length = length;
      pCVar2[length] = 0;
      (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_isNullTerminated =
           true;
      return pCVar2;
    }
  }
  sVar5 = getAllocSize<4096ul>(sVar5);
  dst = (EVP_PKEY_CTX *)operator_new(sVar5 + 0x28,(nothrow_t *)&std::nothrow);
  *(undefined4 *)(dst + 0x10) = 0;
  *(undefined4 *)(dst + 0x14) = 1;
  *(undefined ***)dst = &PTR__RefCount_0019ca28;
  *(size_t *)(dst + 0x18) = sVar5;
  *(undefined8 *)(dst + 0x20) = 0;
  *(code **)(dst + 8) = mem::deallocate;
  local_38.m_p = (BufHdr *)0x0;
  local_38.m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
  if (local_38.m_p == (BufHdr *)0x0) {
    pBVar7 = (BufHdr *)0x0;
  }
  else {
    pBVar7 = local_38.m_p + 1;
    src = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p;
    if (saveContents && src != (C *)0x0) {
      uVar6 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length;
      if (length <= uVar6) {
        uVar6 = length;
      }
      __wrap_memcpy(pBVar7,src,uVar6 * 2);
    }
    pBVar3 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr;
    if (pBVar3 != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(pBVar3->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pBVar3->super_RefCount)._vptr_RefCount)(pBVar3);
        LOCK();
        piVar1 = &(pBVar3->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar4 = (pBVar3->super_RefCount).m_freeFunc, pFVar4 != (FreeFunc *)0x0)) {
          (*pFVar4)(pBVar3);
        }
      }
    }
    pBVar3 = local_38.m_p;
    *(C *)((long)&(pBVar7->super_RefCount)._vptr_RefCount + length * 2) = 0;
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p = (C *)pBVar7;
    local_38.m_p = (BufHdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr = pBVar3;
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length = length;
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_isNullTerminated = true
    ;
  }
  rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
  return (C *)pBVar7;
}

Assistant:

C*
	createBuffer(
		size_t length,
		bool saveContents = false
	) {
		size_t size = (length + 1) * sizeof(C);

		if (this->m_hdr &&
			this->m_hdr->m_bufferSize >= size &&
			this->m_hdr->getRefCount() == 1) {
			if (!this->m_length || !saveContents)
				this->m_p = (C*)(this->m_hdr + 1);

			if (this->m_hdr->getLeftoverBufferSize(this->m_p) >= size) {
				this->m_length = length;
				this->m_p[length] = 0;
				this->m_isNullTerminated = true;
				return this->m_p;
			}
		}

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_EXTRA(rc::BufHdr, (bufferSize), bufferSize);
		if (!hdr)
			return NULL;

		C* p = (C*)(hdr + 1);

		if (saveContents && this->m_p) {
			size_t copyLength = AXL_MIN(length, this->m_length);
			Details::copy(p, this->m_p, copyLength);
		}

		if (this->m_hdr)
			this->m_hdr->release();

		p[length] = 0; // ensure zero termination

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_length = length;
		this->m_isNullTerminated = true;
		return p;
	}